

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int runTest(Options *opts)

{
  uint uVar1;
  ulong uVar2;
  undefined8 uVar3;
  string *in_RDI;
  Value rewriteRoot;
  string rewrite;
  Value root;
  string rewriteActualPath;
  string rewritePath;
  string actualPath;
  string basePath;
  string input;
  int exitCode;
  undefined8 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  string *rewrite_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  Value *in_stack_fffffffffffffe50;
  string *in_stack_fffffffffffffe58;
  char *in_stack_fffffffffffffe88;
  string *in_stack_fffffffffffffea0;
  string *in_stack_fffffffffffffea8;
  allocator local_139;
  string local_138 [72];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [39];
  undefined1 local_89 [33];
  string local_68 [32];
  undefined4 local_48;
  Value *in_stack_ffffffffffffffc0;
  string local_38 [7];
  undefined1 in_stack_ffffffffffffffcf;
  Features *in_stack_ffffffffffffffd0;
  string *in_stack_ffffffffffffffd8;
  string *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 uVar4;
  uint local_4;
  
  uVar4 = 0;
  std::__cxx11::string::c_str();
  readInputTestFile_abi_cxx11_(in_stack_fffffffffffffe88);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_89;
    rewrite_00 = in_RDI;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_89 + 1),".json",(allocator *)__lhs);
    removeSuffix(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
    std::__cxx11::string::~string((string *)(local_89 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_89);
    if (((in_RDI[1].field_0x4 & 1) == 0) &&
       (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) != 0)) {
      uVar3 = std::__cxx11::string::c_str();
      printf("Bad input path. Path does not end with \'.expected\':\n%s\n",uVar3);
      local_4 = 3;
      local_48 = 1;
    }
    else {
      std::operator+(__lhs,(char *)rewrite_00);
      std::operator+(__lhs,(char *)rewrite_00);
      std::operator+(__lhs,(char *)rewrite_00);
      Json::Value::Value((Value *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                         (ValueType)((ulong)in_stack_fffffffffffffe28 >> 0x20));
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_138,"input",&local_139);
      uVar1 = parseAndSaveValueTree
                        ((string *)CONCAT44(uVar4,in_stack_ffffffffffffffe8),
                         in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                         in_stack_ffffffffffffffd0,(bool)in_stack_ffffffffffffffcf,
                         in_stack_ffffffffffffffc0);
      local_4 = uVar1;
      std::__cxx11::string::~string(local_138);
      std::allocator<char>::~allocator((allocator<char> *)&local_139);
      if ((local_4 == 0) && ((in_RDI[1].field_0x4 & 1) == 0)) {
        std::__cxx11::string::string((string *)&stack0xfffffffffffffea0);
        local_4 = rewriteValueTree(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                                   (writeFuncType)__lhs,rewrite_00);
        if (local_4 == 0) {
          Json::Value::Value((Value *)((ulong)uVar1 << 0x20),
                             (ValueType)((ulong)&stack0xfffffffffffffea0 >> 0x20));
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&stack0xfffffffffffffe58,"rewrite",
                     (allocator *)&stack0xfffffffffffffe57);
          local_4 = parseAndSaveValueTree
                              ((string *)CONCAT44(local_4,in_stack_ffffffffffffffe8),
                               in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                               in_stack_ffffffffffffffd0,(bool)in_stack_ffffffffffffffcf,
                               in_stack_ffffffffffffffc0);
          std::__cxx11::string::~string((string *)&stack0xfffffffffffffe58);
          std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe57);
          if (local_4 == 0) {
            local_4 = 0;
          }
          local_48 = 1;
          Json::Value::~Value(in_stack_fffffffffffffe50);
        }
        else {
          local_48 = 1;
        }
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffea0);
      }
      else {
        local_48 = 1;
      }
      Json::Value::~Value(in_stack_fffffffffffffe50);
      std::__cxx11::string::~string(local_f0);
      std::__cxx11::string::~string(local_d0);
      std::__cxx11::string::~string(local_b0);
    }
    std::__cxx11::string::~string(local_68);
  }
  else {
    uVar3 = std::__cxx11::string::c_str();
    printf("Failed to read input or empty input: %s\n",uVar3);
    local_4 = 3;
    local_48 = 1;
  }
  std::__cxx11::string::~string(local_38);
  return local_4;
}

Assistant:

static int runTest(Options const& opts)
{
  int exitCode = 0;

  std::string input = readInputTestFile(opts.path.c_str());
  if (input.empty()) {
    printf("Failed to read input or empty input: %s\n", opts.path.c_str());
    return 3;
  }

  std::string basePath = removeSuffix(opts.path, ".json");
  if (!opts.parseOnly && basePath.empty()) {
    printf("Bad input path. Path does not end with '.expected':\n%s\n",
            opts.path.c_str());
    return 3;
  }

  std::string const actualPath = basePath + ".actual";
  std::string const rewritePath = basePath + ".rewrite";
  std::string const rewriteActualPath = basePath + ".actual-rewrite";

  Json::Value root;
  exitCode = parseAndSaveValueTree(
      input, actualPath, "input",
      opts.features, opts.parseOnly, &root);
  if (exitCode || opts.parseOnly) {
    return exitCode;
  }
  std::string rewrite;
  exitCode = rewriteValueTree(rewritePath, root, opts.write, &rewrite);
  if (exitCode) {
    return exitCode;
  }
  Json::Value rewriteRoot;
  exitCode = parseAndSaveValueTree(
      rewrite, rewriteActualPath, "rewrite",
      opts.features, opts.parseOnly, &rewriteRoot);
  if (exitCode) {
    return exitCode;
  }
  return 0;
}